

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM
          (ChElementBeamTaperedTimoshenkoFPM *this,ShapeFunctionGroupFPM *NB,double eta)

{
  PointerType pdVar1;
  undefined1 auVar2 [16];
  ShapeFunctionGroupFPM *__dest;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *pCVar3;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_> *pCVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double k24;
  double k23;
  double k22;
  double L;
  double LL;
  double LLL;
  ChMatrixNM<double,_6,_6> TNtemp;
  ChMatrixNM<double,_6,_6> Klaw_point;
  ChMatrixNM<double,_6,_14> dAx;
  ChMatrixNM<double,_6,_14> Ax;
  ChMatrixNM<double,_14,_14> Ex;
  ChMatrixNM<double,_6,_12> dNx;
  ChMatrixNM<double,_6,_12> Nx;
  ChMatrixNM<double,_14,_12> Ttemp;
  ChMatrixNM<double,_14,_14> Ex_inv;
  undefined1 *local_2418;
  undefined1 *local_2410;
  Scalar local_2408;
  Scalar local_2400;
  Matrix<double,_6,_12,_1,_6,_12> *local_23f8;
  undefined1 *local_23f0;
  Scalar local_23e8;
  Scalar local_23e0;
  Scalar local_23d8;
  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *local_23d0;
  Scalar local_23c8;
  undefined1 *local_23c0;
  Scalar local_23b8;
  undefined1 *local_23b0;
  Scalar local_23a8;
  Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *local_23a0;
  PointerType local_2398;
  Matrix<double,_6,_12,_1,_6,_12> *local_2390;
  Matrix<double,_6,_12,_1,_6,_12> *local_2388;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_> *local_2380
  ;
  Matrix<double,_6,_12,_1,_6,_12> *local_2378;
  Matrix<double,_6,_12,_1,_6,_12> *local_2368;
  undefined1 *local_2360;
  double local_2358;
  undefined8 local_2350;
  undefined8 uStack_2348;
  ChElementBeamTaperedTimoshenkoFPM *local_2338;
  double local_2330;
  double local_2328;
  PointerType local_2320;
  undefined8 uStack_2318;
  double local_2310;
  double local_2308;
  PointerType local_2300;
  ShapeFunctionGroupFPM *local_22f8;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>
  local_22c0 [2];
  undefined1 *local_2268;
  undefined8 local_2240;
  ChMatrixNM<double,_6,_6> local_21a0;
  undefined1 local_2080 [8];
  RhsNested local_2078;
  DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *local_2070;
  variable_if_dynamic<long,__1> local_2068;
  variable_if_dynamic<long,__1> local_2060;
  Index local_2058;
  Matrix<double,_6,_14,_1,_6,_14> local_1be0;
  Matrix<double,_6,_14,_1,_6,_14> local_1940;
  Matrix<double,_14,_14,_1,_14,_14> local_16a0;
  Matrix<double,_6,_12,_1,_6,_12> local_1080;
  Matrix<double,_6,_12,_1,_6,_12> local_e40;
  undefined1 local_c00 [1376];
  Matrix<double,_14,_14,_1,_14,_14> local_6a0;
  
  local_2398 = (PointerType)(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.length;
  local_2358 = (double)local_2398 * (double)local_2398;
  local_2328 = (double)local_2398 * local_2358;
  local_2350 = (eta + 1.0) * 0.5;
  local_23a0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               (local_2350 * local_2350);
  local_2390 = (Matrix<double,_6,_12,_1,_6,_12> *)(local_2350 * (double)local_23a0);
  local_2368 = (Matrix<double,_6,_12,_1,_6,_12> *)local_2398;
  local_2338 = this;
  local_2330 = eta;
  local_22f8 = NB;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)&local_1940);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)&local_1be0);
  Eigen::DenseBase<Eigen::Matrix<double,_14,_14,_1,_14,_14>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_14,_14,_1,_14,_14>_> *)&local_16a0);
  Eigen::DenseBase<Eigen::Matrix<double,_14,_14,_1,_14,_14>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_14,_14,_1,_14,_14>_> *)&local_6a0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_> *)&local_e40);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_12,_1,_6,_12>_> *)&local_1080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,0);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = (double)local_2368 * local_2350;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 1.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,1);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_2390 = (Matrix<double,_6,_12,_1,_6,_12> *)((double)local_2390 * local_2328);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2390;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)((double)local_23a0 * local_2358);
  local_2368 = local_2388;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)(local_2350 * (double)local_2398);
  local_2360 = local_23c0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 1.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,2);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2390;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = local_2368;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = local_2360;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 1.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,3);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_2368 = (Matrix<double,_6,_12,_1,_6,_12> *)local_2398;
  local_23e8 = (double)local_2398 * local_2350;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,4);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_2390 = (Matrix<double,_6,_12,_1,_6,_12> *)local_2358;
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               (local_2358 * -3.0 * (double)local_23a0);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)((double)local_2368 * -2.0 * local_2350);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = &DAT_bff0000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 1.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1940,5);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr =
       (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
       ((double)local_2390 * 3.0 * (double)local_23a0);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)
               (((double)local_2398 + (double)local_2398) * local_2350);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x3ff0000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = &DAT_bff0000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,0);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 1.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,1);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_23a0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               (local_2358 * 3.0 * (double)local_23a0);
  local_22c0[0].m_xpr = local_23a0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2390 = (Matrix<double,_6,_12,_1,_6,_12> *)
               (((double)local_2398 + (double)local_2398) * local_2350);
  local_2388 = local_2390;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x3ff0000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,2);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = local_23a0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = local_2390;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x3ff0000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,3);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 1.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,4);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23a0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2398;
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               ((double)local_2398 * -6.0 * local_2350);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0xc000000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true,_true> *)
                  local_c00,&local_1be0,5);
  local_2078 = (RhsNested)0x0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)0x1;
  local_2068.m_value = 1;
  *(double *)local_c00._0_8_ = 0.0;
  local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_2080 = (undefined1  [8])local_c00;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>
                      *)local_2080,(Scalar *)&local_21a0);
  local_22c0[0].m_xpr =
       (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
       ((double)local_23a0 * 6.0 * local_2350);
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)local_22c0);
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x4000000000000000;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2388);
  local_23c0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23c0);
  local_23c8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23c8);
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23d0);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2400);
  local_2408 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar3 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
           operator_(pCVar3,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  operator_(pCVar3,(Scalar *)&local_2418);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>_> *)
           local_2080);
  Eigen::DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)local_c00);
  local_2080 = (undefined1  [8])(local_c00 + 0xc0);
  local_2068.m_value = 2;
  local_2060.m_value = 0;
  local_2058 = 0xc;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)local_c00;
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_14,_12,_1,_14,_12>,_12,_12,_false>,_true>::run
            ((Block<Eigen::Matrix<double,_14,_12,_1,_14,_12>,_12,_12,_false> *)local_2080);
  ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint
            (&local_21a0,
             (local_2338->tapered_section_fpm).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,local_2330);
  local_2300 = (PointerType)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[1];
  local_22f0 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0xe];
  uStack_22e8 = 0;
  local_22e0 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0xf];
  uStack_22d8 = 0;
  local_2320 = (PointerType)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[2];
  uStack_2318 = 0;
  local_23c0 = (undefined1 *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[7];
  local_23c8 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[8];
  local_22d0 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[8];
  uStack_22c8 = 0;
  local_23d0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[9];
  local_23a0 = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[10];
  local_2390 = (Matrix<double,_6,_12,_1,_6,_12> *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0xb];
  local_2368 = (Matrix<double,_6,_12,_1,_6,_12> *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0x10];
  local_2360 = (undefined1 *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0x11];
  local_2338 = (ChElementBeamTaperedTimoshenkoFPM *)
               local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0x1d];
  local_2308 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0x23];
  local_2310 = local_21a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array[0x1c] * -6.0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,0);
  local_22c0[0].m_row = 0;
  local_2350 = -0.0;
  uStack_2348 = 0x8000000000000000;
  auVar5._0_8_ = -(double)local_2320;
  auVar5._8_4_ = (int)uStack_2318;
  auVar5._12_4_ = (uint)((ulong)uStack_2318 >> 0x20) ^ 0x80000000;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  pdVar1 = (PointerType)vmovlps_avx(auVar5);
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = pdVar1;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_2360;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_2338;
  local_2320 = local_2398;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)local_2360 * (double)local_2398 * -3.0;
  auVar2 = vfmadd231sd_fma(auVar14,auVar18,ZEXT816(0x4018000000000000));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (double)local_2398 * -3.0 * local_2330;
  auVar2 = vfmadd213sd_fma(auVar6,auVar22,auVar2);
  local_23f8 = auVar2._0_8_;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)((double)local_2360 * -2.0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_2368;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_2310;
  local_2320 = (PointerType)((double)local_2320 * 3.0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_2320;
  auVar2 = vfmadd231sd_fma(auVar19,auVar7,auVar15);
  local_2360 = (undefined1 *)((double)local_2320 * local_2330);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_2360;
  auVar2 = vfmadd231sd_fma(auVar2,auVar8,auVar15);
  local_2410 = auVar2._0_8_;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = (double)local_2368 + (double)local_2368;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  auVar9._0_4_ = (uint)local_22f0 ^ (uint)local_2350;
  auVar9._4_4_ = local_22f0._4_4_ ^ local_2350._4_4_;
  auVar9._8_4_ = (uint)uStack_22e8 ^ (uint)uStack_2348;
  auVar9._12_4_ = uStack_22e8._4_4_ ^ uStack_2348._4_4_;
  local_23d8 = (Scalar)vmovlps_avx(auVar9);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  auVar10._0_4_ = (uint)local_2350 ^ (uint)local_22d0;
  auVar10._4_4_ = local_2350._4_4_ ^ local_22d0._4_4_;
  auVar10._8_4_ = (uint)uStack_2348 ^ (uint)uStack_22c8;
  auVar10._12_4_ = uStack_2348._4_4_ ^ uStack_22c8._4_4_;
  local_23b0 = (undefined1 *)vmovlps_avx(auVar10);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  auVar11._0_4_ = (uint)local_2350 ^ (uint)local_22e0;
  auVar11._4_4_ = local_2350._4_4_ ^ local_22e0._4_4_;
  auVar11._8_4_ = (uint)uStack_2348 ^ (uint)uStack_22d8;
  auVar11._12_4_ = uStack_2348._4_4_ ^ uStack_22d8._4_4_;
  local_23b8 = (Scalar)vmovlps_avx(auVar11);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,1);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = local_2300;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_2390;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_2308;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (double)local_2390 * (double)local_2320;
  auVar5 = vfmadd231sd_fma(auVar12,auVar20,ZEXT816(0x4018000000000000));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_2360;
  auVar2 = vfmadd231sd_fma(auVar5,auVar16,auVar2);
  local_23f8 = auVar2._0_8_;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)((double)local_2390 + (double)local_2390);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_23a0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_2338;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (double)local_23a0 * (double)local_2398 * -3.0;
  auVar2 = vfmadd231sd_fma(auVar17,auVar23,ZEXT816(0xc018000000000000));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (double)local_2398 * -3.0 * local_2330;
  auVar2 = vfmadd213sd_fma(auVar13,auVar21,auVar2);
  local_2410 = auVar2._0_8_;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = (double)local_23a0 * -2.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23c8);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23c0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23d0);
  local_23d8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23d8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,2);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x3ff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,3);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,4);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,5);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 1.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,6);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = &DAT_bff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,7);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = &DAT_bff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,8);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = local_2398;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x3ff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,9);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2328);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2358);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2398);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x3ff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23d8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,10);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2328);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2358);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2398);
  local_2410 = (undefined1 *)0x3ff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23d8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,0xb);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2398);
  local_23b8 = 1.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23b8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,0xc);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)(local_2358 * -3.0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = (double)local_2398 * -2.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = &DAT_bff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true,_true> *)
                  local_2080,&local_16a0,0xd);
  local_22c0[0].m_row = 0;
  local_22c0[0].m_col = 1;
  local_22c0[0].m_currentBlockRows = 1;
  local_22c0[0].m_xpr = (Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true> *)local_2080;
  ((MapBase<Eigen::Block<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_1,_14,_true>,_0> *)
  (((PlainObjectBase<Eigen::Matrix<double,_6,_14,_1,_6,_14>_> *)local_2080)->m_storage).m_data.array
  )->m_data = (PointerType)0x0;
  local_2388 = (Matrix<double,_6,_12,_1,_6,_12> *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(local_22c0,(Scalar *)&local_2388);
  local_23f8 = (Matrix<double,_6,_12,_1,_6,_12> *)(local_2358 * 3.0);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f8);
  local_23f0 = (undefined1 *)((double)local_2398 + (double)local_2398);
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23f0);
  local_2400 = 1.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2400);
  local_2408 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_2408);
  local_2410 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2410);
  local_23e8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e8);
  local_2418 = (undefined1 *)0x0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_2418);
  local_23e0 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23e0);
  local_23d8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23d8);
  local_23b0 = &DAT_bff0000000000000;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,(Scalar *)&local_23b0);
  local_23b8 = 0.0;
  pCVar4 = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
           operator_(pCVar4,&local_23b8);
  local_23a8 = 0.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  operator_(pCVar4,&local_23a8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_1,_14,_true>_>::
  finished(local_22c0);
  Eigen::internal::
  compute_inverse<Eigen::Matrix<double,_14,_14,_1,_14,_14>,_Eigen::Matrix<double,_14,_14,_1,_14,_14>,_14>
  ::run(&local_16a0,&local_6a0);
  local_2080 = (undefined1  [8])&local_1940;
  local_2078 = &local_6a0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)local_c00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,12,1,6,12>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,14,1,6,14>,Eigen::Matrix<double,14,14,1,14,14>,0>,Eigen::Matrix<double,14,12,1,14,12>,0>>
            (&local_e40,
             (Product<Eigen::Product<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_Eigen::Matrix<double,_14,_14,_1,_14,_14>,_0>,_Eigen::Matrix<double,_14,_12,_1,_14,_12>,_0>
              *)local_2080);
  local_2080 = (undefined1  [8])&local_1be0;
  local_2078 = &local_6a0;
  local_2070 = (DenseBase<Eigen::Matrix<double,_14,_12,_1,_14,_12>_> *)local_c00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,12,1,6,12>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,14,1,6,14>,Eigen::Matrix<double,14,14,1,14,14>,0>,Eigen::Matrix<double,14,12,1,14,12>,0>>
            (&local_1080,
             (Product<Eigen::Product<Eigen::Matrix<double,_6,_14,_1,_6,_14>,_Eigen::Matrix<double,_14,_14,_1,_14,_14>,_0>,_Eigen::Matrix<double,_14,_12,_1,_14,_12>,_0>
              *)local_2080);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_22c0);
  local_2268 = &DAT_bff0000000000000;
  local_2240 = 0x3ff0000000000000;
  local_2388 = &local_1080;
  local_2380 = local_22c0;
  local_2378 = &local_e40;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,12,1,6,12>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,12,1,6,12>const,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,12,1,6,12>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,6,12,1,6,12>> *)local_2080,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_0>_>_>
              *)&local_2388);
  __dest = local_22f8;
  memcpy(&(local_22f8->
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          ).super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,&local_e40,0x240);
  memcpy(__dest,(PlainObjectBase<Eigen::Matrix<double,6,12,1,6,12>> *)local_2080,0x240);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::ShapeFunctionsTimoshenkoFPM(ShapeFunctionGroupFPM& NB, double eta) {
    // The shape functions have referenced two papers below, especially the first one:
    // Alexander R.Stäblein,and Morten H.Hansen.
    // "Timoshenko beam element with anisotropic cross-sectional properties."
    // ECCOMAS Congress 2016, VII European Congress on Computational Methods in Applied Sciences and Engineering.
    // Crete Island, Greece, 5 - 10 June 2016
    //
    // Taeseong Kim, Anders M.Hansen,and Kim Branner.
    // "Development of an anisotropic beam finite element for composite wind turbine blades in multibody system."
    // Renewable Energy 59(2013) : 172 - 183.

    // eta = 2 * x/L;
    // x = (-L/2, L/2),  hence eta = (-1, 1)
    double L = this->length;
    double LL = L * L;
    double LLL = LL * L;
    double eta1 = (eta + 1) / 2.0;
    double eta2 = eta1 * eta1;
    double eta3 = eta2 * eta1;

    ChMatrixNM<double, 6, 14> Ax;
    Ax.setZero();
    ChMatrixNM<double, 6, 14> dAx;
    dAx.setZero();
    ChMatrixNM<double, 14, 14> Ex;
    Ex.setZero();
    ChMatrixNM<double, 14, 14> Ex_inv;
    Ex_inv.setZero();
    ChMatrixNM<double, 6, 12> Nx;
    Nx.setZero();
    ChMatrixNM<double, 6, 12> dNx;
    dNx.setZero();

    // The coefficient matrix of the displacements and rotations with respect to the shape function coefficient vector
    // c_v note: the shape function coefficient vector is as below: c_v = [c1 c2 c3 c4 c5 c6 c7 c8 c9 c10 c13 c14 c11
    // c12].';  // notice the order of c11 c12 c13 c14
    Ax.row(0) << L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ax.row(1) << 0, 0, LLL * eta3, LL * eta2, L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ax.row(2) << 0, 0, 0, 0, 0, 0, LLL * eta3, LL * eta2, L * eta1, 1, 0, 0, 0, 0;
    Ax.row(3) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, L * eta1, 1;
    Ax.row(4) << 0, 0, 0, 0, 0, 0, -3 * LL * eta2, -2 * L * eta1, -1, 0, 1, 0, 0, 0;
    Ax.row(5) << 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;

    // The derivative of Ax
    dAx.row(0) << 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    dAx.row(1) << 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    dAx.row(2) << 0, 0, 0, 0, 0, 0, 3 * LL * eta2, 2 * L * eta1, 1, 0, 0, 0, 0, 0;
    dAx.row(3) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0;
    dAx.row(4) << 0, 0, 0, 0, 0, 0, -6 * L * eta1, -2, 0, 0, 0, 0, 0, 0;
    dAx.row(5) << 0, 0, 6 * L * eta1, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;

    // A temporary transformation matrix
    ChMatrixNM<double, 14, 12> Ttemp;
    Ttemp.setZero();
    Ttemp.block<12, 12>(2, 0).setIdentity();

    // the cross-sectional material stiffness matrix Klaw along beam element may be variant
    // due to different Klaw at two ends of tapered-sectional beam
    ChMatrixNM<double, 6, 6> Klaw_point = this->tapered_section_fpm->GetKlawAtPoint(eta);
    // double k11 = Klaw_point(0, 0);
    double k12 = Klaw_point(0, 1);
    double k13 = Klaw_point(0, 2);
    // double k14 = Klaw_point(0, 3);
    // double k15 = Klaw_point(0, 4);
    // double k16 = Klaw_point(0, 5);
    double k22 = Klaw_point(1, 1);
    double k23 = Klaw_point(1, 2);
    double k24 = Klaw_point(1, 3);
    double k25 = Klaw_point(1, 4);
    double k26 = Klaw_point(1, 5);
    double k33 = Klaw_point(2, 2);
    double k34 = Klaw_point(2, 3);
    double k35 = Klaw_point(2, 4);
    double k36 = Klaw_point(2, 5);
    // double k44 = Klaw_point(3, 3);
    // double k45 = Klaw_point(3, 4);
    // double k46 = Klaw_point(3, 5);
    double k55 = Klaw_point(4, 4);
    double k56 = Klaw_point(4, 5);
    double k66 = Klaw_point(5, 5);

    // The coefficient matrix of the equilibrium and compatibility equations
    // with respect to the shape function coefficient vector c_v
    Ex.row(0) << -k13, 0, 6 * k56 - 3 * L * k36 - 3 * L * eta * k36, -2 * k36, 0, 0,
        3 * L * k35 - 6 * k55 + 3 * L * eta * k35, 2 * k35, 0, 0, -k33, -k23, -k34, 0;
    Ex.row(1) << k12, 0, 6 * k66 + 3 * L * k26 + 3 * L * eta * k26, 2 * k26, 0, 0,
        -6 * k56 - 3 * L * k25 - 3 * L * eta * k25, -2 * k25, 0, 0, k23, k22, k24, 0;
    Ex.row(2) << 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(3) << 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(4) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0;
    Ex.row(5) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1;
    Ex.row(6) << 0, 0, 0, 0, 0, 0, 0, 0, -1, 0, 1, 0, 0, 0;
    Ex.row(7) << 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;
    Ex.row(8) << L, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(9) << 0, 0, LLL, LL, L, 1, 0, 0, 0, 0, 0, 0, 0, 0;
    Ex.row(10) << 0, 0, 0, 0, 0, 0, LLL, LL, L, 1, 0, 0, 0, 0;
    Ex.row(11) << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, L, 1;
    Ex.row(12) << 0, 0, 0, 0, 0, 0, -3 * LL, -2 * L, -1, 0, 1, 0, 0, 0;
    Ex.row(13) << 0, 0, 3 * LL, 2 * L, 1, 0, 0, 0, 0, 0, 0, -1, 0, 0;

    // The inverse of Ex
    Ex_inv = Ex.inverse();

    // The shape function matrix at dimensionless position eta
    Nx = Ax * Ex_inv * Ttemp;
    // and its derivative
    dNx = dAx * Ex_inv * Ttemp;  // DO NOT add Ax * dEx_inv * Ttemp, see the first paper please.

    // A temporary matrix
    ChMatrixNM<double, 6, 6> TNtemp;
    TNtemp.setZero();
    TNtemp(1, 5) = -1.0;
    TNtemp(2, 4) = 1.0;

    // The strain displacement matrix at dimensionless position eta
    ChMatrixNM<double, 6, 12> Bx = dNx + TNtemp * Nx;

    // return result
    NB = std::make_tuple(Nx, Bx);
}